

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::ChannelsSetCurrent(ImDrawList *this,int idx)

{
  int iVar1;
  ImDrawChannel *pIVar2;
  int iVar3;
  ImDrawChannel *pIVar4;
  int idx_local;
  ImDrawList *this_local;
  
  if (this->_ChannelsCount <= idx) {
    __assert_fail("idx < _ChannelsCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x157,"void ImDrawList::ChannelsSetCurrent(int)");
  }
  if (this->_ChannelsCurrent != idx) {
    pIVar4 = (this->_Channels).Data + this->_ChannelsCurrent;
    iVar1 = (this->CmdBuffer).Capacity;
    (pIVar4->CmdBuffer).Size = (this->CmdBuffer).Size;
    (pIVar4->CmdBuffer).Capacity = iVar1;
    (pIVar4->CmdBuffer).Data = (this->CmdBuffer).Data;
    pIVar4 = (this->_Channels).Data;
    iVar1 = this->_ChannelsCurrent;
    iVar3 = (this->IdxBuffer).Capacity;
    pIVar2 = pIVar4 + iVar1;
    (pIVar2->IdxBuffer).Size = (this->IdxBuffer).Size;
    (pIVar2->IdxBuffer).Capacity = iVar3;
    pIVar4[iVar1].IdxBuffer.Data = (this->IdxBuffer).Data;
    this->_ChannelsCurrent = idx;
    pIVar4 = (this->_Channels).Data + this->_ChannelsCurrent;
    iVar1 = (pIVar4->CmdBuffer).Capacity;
    (this->CmdBuffer).Size = (pIVar4->CmdBuffer).Size;
    (this->CmdBuffer).Capacity = iVar1;
    (this->CmdBuffer).Data = (pIVar4->CmdBuffer).Data;
    pIVar4 = (this->_Channels).Data;
    iVar1 = this->_ChannelsCurrent;
    pIVar2 = pIVar4 + iVar1;
    iVar3 = (pIVar2->IdxBuffer).Capacity;
    (this->IdxBuffer).Size = (pIVar2->IdxBuffer).Size;
    (this->IdxBuffer).Capacity = iVar3;
    (this->IdxBuffer).Data = pIVar4[iVar1].IdxBuffer.Data;
    this->_IdxWritePtr = (this->IdxBuffer).Data + (this->IdxBuffer).Size;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsSetCurrent(int idx)
{
    IM_ASSERT(idx < _ChannelsCount);
    if (_ChannelsCurrent == idx) return;
    memcpy(&_Channels.Data[_ChannelsCurrent].CmdBuffer, &CmdBuffer, sizeof(CmdBuffer)); // copy 12 bytes, four times
    memcpy(&_Channels.Data[_ChannelsCurrent].IdxBuffer, &IdxBuffer, sizeof(IdxBuffer));
    _ChannelsCurrent = idx;
    memcpy(&CmdBuffer, &_Channels.Data[_ChannelsCurrent].CmdBuffer, sizeof(CmdBuffer));
    memcpy(&IdxBuffer, &_Channels.Data[_ChannelsCurrent].IdxBuffer, sizeof(IdxBuffer));
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size;
}